

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  LookasideSlot *local_50;
  LookasideSlot *p;
  int local_40;
  int i;
  int nSm;
  int nBig;
  sqlite3_int64 szAlloc;
  void *pStart;
  int cnt_local;
  int sz_local;
  void *pBuf_local;
  sqlite3 *db_local;
  
  _nSm = (long)sz * (long)cnt;
  iVar1 = sqlite3LookasideUsed(db,(int *)0x0);
  if (iVar1 < 1) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    pStart._4_4_ = sz & 0xfffffff8;
    if ((int)pStart._4_4_ < 9) {
      pStart._4_4_ = 0;
    }
    pStart._0_4_ = cnt;
    if (cnt < 0) {
      pStart._0_4_ = 0;
    }
    if ((pStart._4_4_ == 0) || ((int)pStart == 0)) {
      pStart._4_4_ = 0;
      szAlloc = 0;
    }
    else {
      szAlloc = (sqlite3_int64)pBuf;
      if (pBuf == (void *)0x0) {
        sqlite3BeginBenignMalloc();
        szAlloc = (sqlite3_int64)sqlite3Malloc(_nSm);
        sqlite3EndBenignMalloc();
        if ((void *)szAlloc != (void *)0x0) {
          iVar1 = sqlite3MallocSize((void *)szAlloc);
          _nSm = (u64)iVar1;
        }
      }
    }
    if ((int)pStart._4_4_ < 0x180) {
      if ((int)pStart._4_4_ < 0x100) {
        if ((int)pStart._4_4_ < 1) {
          i = 0;
        }
        else {
          i = (int)((long)_nSm / (long)(int)pStart._4_4_);
        }
        local_40 = 0;
      }
      else {
        i = (int)((long)_nSm / (long)(int)(pStart._4_4_ + 0x80));
        local_40 = (int)((long)(_nSm - (long)(int)(pStart._4_4_ * i)) / 0x80);
      }
    }
    else {
      i = (int)((long)_nSm / (long)(int)(pStart._4_4_ + 0x180));
      local_40 = (int)((long)(_nSm - (long)(int)(pStart._4_4_ * i)) / 0x80);
    }
    (db->lookaside).pStart = (void *)szAlloc;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)pStart._4_4_;
    (db->lookaside).szTrue = (u16)pStart._4_4_;
    if (szAlloc == 0) {
      (db->lookaside).pStart = db;
      (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
      (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      (db->lookaside).pMiddle = db;
      (db->lookaside).pEnd = db;
      (db->lookaside).bDisable = 1;
      (db->lookaside).sz = 0;
      (db->lookaside).bMalloced = '\0';
      (db->lookaside).nSlot = 0;
    }
    else {
      local_50 = (LookasideSlot *)szAlloc;
      for (p._4_4_ = 0; p._4_4_ < i; p._4_4_ = p._4_4_ + 1) {
        local_50->pNext = (db->lookaside).pInit;
        (db->lookaside).pInit = local_50;
        local_50 = (LookasideSlot *)((long)&local_50->pNext + (long)(int)pStart._4_4_);
      }
      (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
      (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      (db->lookaside).pMiddle = local_50;
      for (p._4_4_ = 0; p._4_4_ < local_40; p._4_4_ = p._4_4_ + 1) {
        local_50->pNext = (db->lookaside).pSmallInit;
        (db->lookaside).pSmallInit = local_50;
        local_50 = local_50 + 0x10;
      }
      (db->lookaside).pEnd = local_50;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
      (db->lookaside).nSlot = i + local_40;
    }
    db_local._4_4_ = 0;
  }
  else {
    db_local._4_4_ = 5;
  }
  return db_local._4_4_;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc = sz*(sqlite3_int64)cnt;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = db;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = db;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}